

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O1

void __thiscall jsonnet::internal::CompilerPass::visit(CompilerPass *this,Assert *ast)

{
  (*this->_vptr_CompilerPass[6])(this,&ast->cond);
  if (ast->message != (AST *)0x0) {
    (*this->_vptr_CompilerPass[1])(this,&ast->colonFodder);
    (*this->_vptr_CompilerPass[6])(this,&ast->message);
  }
  (*this->_vptr_CompilerPass[1])(this,&ast->semicolonFodder);
  (*this->_vptr_CompilerPass[6])(this,&ast->rest);
  return;
}

Assistant:

void CompilerPass::visit(Assert *ast)
{
    expr(ast->cond);
    if (ast->message != nullptr) {
        fodder(ast->colonFodder);
        expr(ast->message);
    }
    fodder(ast->semicolonFodder);
    expr(ast->rest);
}